

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzAddMod(word *c,word *a,word *b,word *mod,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (n == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 1;
    sVar4 = 0;
    uVar5 = 0;
    do {
      uVar3 = a[sVar4];
      uVar6 = uVar5 + a[sVar4];
      uVar1 = b[sVar4];
      uVar7 = uVar6 + b[sVar4];
      c[sVar4] = uVar7;
      uVar5 = (ulong)(CARRY8(uVar6,uVar1) || CARRY8(uVar5,uVar3));
      uVar3 = 0;
      if (mod[sVar4] == uVar7) {
        uVar3 = uVar2;
      }
      uVar2 = mod[sVar4] < uVar7 | uVar3;
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
    uVar2 = uVar2 | uVar5;
  }
  zzSubAndW(c,mod,n,-uVar2);
  return;
}

Assistant:

void SAFE(zzAddMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	register word carry = 0;
	register word mask = 1;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	// add 	
	for (i = 0; i < n; ++i)
	{
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		c[i] = w + b[i];
		carry |= wordLess01(c[i], w);
		// mask <- mod[i] < c[i] || mask && mod[i] == c[i];
		mask &= wordEq01(mod[i], c[i]);
		mask |= wordLess01(mod[i], c[i]);
	}
	// sub
	mask |= carry;
	mask = WORD_0 - mask;
	zzSubAndW(c, mod, n, mask);
	w = mask = carry = 0;
}